

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O0

uint32_t helper_advsimd_add2h_aarch64(uint32_t two_a,uint32_t two_b,void *fpstp)

{
  float16 fVar1;
  float16 fVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  float_status *fpst;
  uint32_t r2;
  uint32_t r1;
  float16 b2;
  float16 b1;
  float16 a2;
  float16 a1;
  void *fpstp_local;
  uint32_t two_b_local;
  uint32_t two_a_local;
  
  uVar3 = extract32(two_a,0,0x10);
  uVar4 = extract32(two_a,0x10,0x10);
  uVar5 = extract32(two_b,0,0x10);
  uVar6 = extract32(two_b,0x10,0x10);
  fVar1 = float16_add_aarch64((float16)uVar3,(float16)uVar5,(float_status *)fpstp);
  fVar2 = float16_add_aarch64((float16)uVar4,(float16)uVar6,(float_status *)fpstp);
  uVar3 = deposit32((uint)fVar1,0x10,0x10,(uint)fVar2);
  return uVar3;
}

Assistant:

ADVSIMD_TWOHALFOP(add)
ADVSIMD_TWOHALFOP(sub)
ADVSIMD_TWOHALFOP(mul)
ADVSIMD_TWOHALFOP(div)
ADVSIMD_TWOHALFOP(min)
ADVSIMD_TWOHALFOP(max)
ADVSIMD_TWOHALFOP(minnum)
ADVSIMD_TWOHALFOP(maxnum)

/* Data processing - scalar floating-point and advanced SIMD */
static float16 float16_mulx(float16 a, float16 b, void *fpstp)
{
    float_status *fpst = fpstp;

    a = float16_squash_input_denormal(a, fpst);
    b = float16_squash_input_denormal(b, fpst);

    if ((float16_is_zero(a) && float16_is_infinity(b)) ||
        (float16_is_infinity(a) && float16_is_zero(b))) {
        /* 2.0 with the sign bit set to sign(A) XOR sign(B) */
        return make_float16((1U << 14) |
                            ((float16_val(a) ^ float16_val(b)) & (1U << 15)));
    }
    return float16_mul(a, b, fpst);
}